

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O1

bool pvmath::haarTransform<float>(void)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  vector<float,_std::allocator<float>_> input;
  vector<float,_std::allocator<float>_> inverse;
  vector<float,_std::allocator<float>_> direct;
  bool local_7a;
  allocator_type local_79;
  vector<float,_std::allocator<float>_> local_78;
  vector<float,_std::allocator<float>_> local_60;
  void *local_48 [3];
  
  uVar2 = Test_Helper::runCount();
  local_7a = uVar2 == 0;
  if (!local_7a) {
    uVar8 = 0;
    do {
      uVar3 = rand();
      uVar3 = uVar3 & 0xff;
      if (uVar3 < 0x11) {
        uVar3 = 0x10;
      }
      uVar3 = uVar3 * 2;
      uVar4 = rand();
      uVar4 = uVar4 & 0xff;
      if (uVar4 < 0x11) {
        uVar4 = 0x10;
      }
      uVar4 = uVar4 * 2;
      uVar6 = (ulong)(uVar4 * uVar3);
      std::vector<float,_std::allocator<float>_>::vector(&local_78,uVar6,(allocator_type *)local_48)
      ;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_48,uVar6,(allocator_type *)&local_60
                );
      if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish !=
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start) {
        uVar9 = 0;
        do {
          iVar5 = rand();
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar9] = (float)(iVar5 % 0xff);
          iVar5 = rand();
          *(float *)((long)local_48[0] + uVar9 * 4) = (float)(iVar5 % 0xff);
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)((long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      std::vector<float,_std::allocator<float>_>::vector(&local_60,uVar6,&local_79);
      Image_Function::HaarDirectTransform
                (&local_78,(vector<float,_std::allocator<float>_> *)local_48,(ulong)uVar3,
                 (ulong)uVar4);
      Image_Function::HaarInverseTransform
                ((vector<float,_std::allocator<float>_> *)local_48,&local_60,(ulong)uVar3,
                 (ulong)uVar4);
      bVar10 = (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start != 0;
      if (bVar10) {
        uVar6 = (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        auVar11._8_4_ = 0x7fffffff;
        auVar11._0_8_ = 0x7fffffff7fffffff;
        auVar11._12_4_ = 0x7fffffff;
        auVar11 = vandps_avx512vl(ZEXT416((uint)(*local_78.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start -
                                                *local_60.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_start)),auVar11)
        ;
        if (auVar11._0_4_ <= 0.001) {
          uVar9 = 1;
          do {
            uVar7 = uVar9;
            if (uVar6 + (uVar6 == 0) == uVar7) break;
            auVar1._8_4_ = 0x7fffffff;
            auVar1._0_8_ = 0x7fffffff7fffffff;
            auVar1._12_4_ = 0x7fffffff;
            auVar11 = vandps_avx512vl(ZEXT416((uint)(local_78.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar7] -
                                                  local_60.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar7])),
                                      auVar1);
            uVar9 = uVar7 + 1;
          } while (auVar11._0_4_ <= 0.001);
          bVar10 = uVar7 < uVar6;
        }
      }
      if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (float *)0x0) {
        operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48[0] != (void *)0x0) {
        operator_delete(local_48[0]);
      }
      if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (float *)0x0) {
        operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (bVar10) {
        return local_7a;
      }
      uVar8 = uVar8 + 1;
      uVar2 = Test_Helper::runCount();
      local_7a = uVar8 >= uVar2;
    } while (uVar8 < uVar2);
  }
  return local_7a;
}

Assistant:

bool haarTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width  = Unit_Test::randomValue<uint32_t>( 16u, 256u ) * 2; // to make sure that number is divided by 2
            const uint32_t height = Unit_Test::randomValue<uint32_t>( 16u, 256u ) * 2;
            std::vector< _Type > input ( width * height );
            std::vector< _Type > direct( width * height );

            for ( size_t id = 0; id < input.size(); ++id ) {
                input [id] = Unit_Test::randomFloatValue<_Type>( 0, 255, 1.0f );
                direct[id] = Unit_Test::randomFloatValue<_Type>( 0, 255, 1.0f );
            }

            std::vector< _Type > inverse ( width * height );
            Image_Function::HaarDirectTransform ( input, direct, width, height );
            Image_Function::HaarInverseTransform( direct, inverse, width, height );

            for ( size_t id = 0; id < input.size(); ++id ) {
                if (std::fabs(input[id] - inverse[id]) > 0.001f)
                    return false;
            }
        }

        return true;
    }